

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDScanner::scanAttListDecl(DTDScanner *this)

{
  uint uVar1;
  ReaderMgr *this_00;
  DTDGrammar *pDVar2;
  DocTypeHandler *pDVar3;
  XMLBufferMgr *this_01;
  bool bVar4;
  bool bVar5;
  XMLCh toCheck;
  int iVar6;
  ValSchemes VVar7;
  AttTypes AVar8;
  XMLBuffer *pXVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var;
  DTDElementDecl *this_02;
  UnexpectedEOFException *this_03;
  XMLReader *this_04;
  XMLSize_t XVar11;
  XMLAttDef *this_05;
  XMLValidator *this_06;
  XMLAttDef *attDef;
  XMLCh nextCh;
  bool seenAnId;
  XMLBuffer *tmpBuf;
  XMLBufBid bbTmp;
  DTDElementDecl *elemDecl;
  undefined1 local_20 [8];
  XMLBufBid bbName;
  DTDScanner *this_local;
  
  bbName.fMgr = (XMLBufferMgr *)this;
  bVar4 = checkForPERef(this,false,true);
  if (bVar4) {
    XMLBufBid::XMLBufBid((XMLBufBid *)local_20,this->fBufMgr);
    this_00 = this->fReaderMgr;
    pXVar9 = XMLBufBid::getBuffer((XMLBufBid *)local_20);
    bVar4 = ReaderMgr::getName(this_00,pXVar9);
    if (bVar4) {
      pDVar2 = this->fDTDGrammar;
      uVar1 = this->fEmptyNamespaceId;
      pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
      iVar6 = (*(pDVar2->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                        (pDVar2,(ulong)uVar1,0,pXVar10);
      bbTmp.fMgr = (XMLBufferMgr *)CONCAT44(extraout_var,iVar6);
      if (bbTmp.fMgr == (XMLBufferMgr *)0x0) {
        this_02 = (DTDElementDecl *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        pXVar10 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
        DTDElementDecl::DTDElementDecl
                  (this_02,pXVar10,this->fEmptyNamespaceId,Any,this->fGrammarPoolMemoryManager);
        bbTmp.fMgr = (XMLBufferMgr *)this_02;
        XMLElementDecl::setCreateReason((XMLElementDecl *)this_02,AttList);
        this_01 = bbTmp.fMgr;
        bVar4 = isReadingExternalEntity(this);
        XMLElementDecl::setExternalElemDeclaration((XMLElementDecl *)this_01,bVar4);
        (*(this->fDTDGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                  (this->fDTDGrammar,bbTmp.fMgr,0);
      }
      if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
        (*this->fDocTypeHandler->_vptr_DocTypeHandler[0xe])(this->fDocTypeHandler,bbTmp.fMgr);
      }
      XMLBufBid::XMLBufBid((XMLBufBid *)&tmpBuf,this->fBufMgr);
      pXVar9 = XMLBufBid::getBuffer((XMLBufBid *)&tmpBuf);
      bVar4 = false;
      while( true ) {
        toCheck = ReaderMgr::peekNextChar(this->fReaderMgr);
        if (toCheck == L'\0') {
          this_03 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_03,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                     ,0x292,Gen_UnexpectedEOF,this->fMemoryManager);
          __cxa_throw(this_03,&UnexpectedEOFException::typeinfo,
                      UnexpectedEOFException::~UnexpectedEOFException);
        }
        if (toCheck == L'>') break;
        this_04 = ReaderMgr::getCurrentReader(this->fReaderMgr);
        bVar5 = XMLReader::isWhitespace(this_04,toCheck);
        if (bVar5) {
          if (this->fDocTypeHandler == (DocTypeHandler *)0x0) {
            ReaderMgr::skipPastSpaces(this->fReaderMgr);
          }
          else {
            ReaderMgr::getSpaces(this->fReaderMgr,pXVar9);
            pDVar3 = this->fDocTypeHandler;
            pXVar10 = XMLBuffer::getRawBuffer(pXVar9);
            XVar11 = XMLBuffer::getLen(pXVar9);
            (*pDVar3->_vptr_DocTypeHandler[6])(pDVar3,pXVar10,XVar11);
          }
        }
        else if (toCheck == L'%') {
          ReaderMgr::getNextChar(this->fReaderMgr);
          expandPERef(this,false,false,true,false);
        }
        else {
          this_05 = scanAttDef(this,(DTDElementDecl *)bbTmp.fMgr,pXVar9);
          if (this_05 == (XMLAttDef *)0x0) {
            ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
            goto LAB_003f3e54;
          }
          VVar7 = XMLScanner::getValidationScheme(this->fScanner);
          if ((VVar7 == Val_Always) && (AVar8 = XMLAttDef::getType(this_05), AVar8 == ID)) {
            if (bVar4) {
              this_06 = XMLScanner::getValidator(this->fScanner);
              pXVar10 = XMLElementDecl::getFullName((XMLElementDecl *)bbTmp.fMgr);
              XMLValidator::emitError
                        (this_06,MultipleIdAttrs,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            bVar4 = true;
          }
        }
      }
      ReaderMgr::getNextChar(this->fReaderMgr);
LAB_003f3e54:
      if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
        (*this->fDocTypeHandler->_vptr_DocTypeHandler[8])(this->fDocTypeHandler,bbTmp.fMgr);
      }
      XMLBufBid::~XMLBufBid((XMLBufBid *)&tmpBuf);
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedElementName);
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
    }
    XMLBufBid::~XMLBufBid((XMLBufBid *)local_20);
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
  }
  return;
}

Assistant:

void DTDScanner::scanAttListDecl()
{
    // Space is required here, so check for a PE ref
    if (!checkForPERef(false, true))
    {
        fScanner->emitError(XMLErrs::ExpectedWhitespace);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    //
    //  Next should be the name of the element it belongs to, so get a buffer
    //  and get the name into it.
    //
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedElementName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    //
    //  Find this element's declaration. If it has not been declared yet,
    //  we will force one into the list, but not mark it as declared.
    //
    DTDElementDecl* elemDecl = (DTDElementDecl*) fDTDGrammar->getElemDecl(fEmptyNamespaceId, 0, bbName.getRawBuffer(), Grammar::TOP_LEVEL_SCOPE);
    if (!elemDecl)
    {
        //
        //  Lets fault in a declaration and add it to the pool. We mark
        //  it having been created because of an attlist. Later, if its
        //  declared, this will be updated.
        //
        elemDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            bbName.getRawBuffer()
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        elemDecl->setCreateReason(XMLElementDecl::AttList);
        elemDecl->setExternalElemDeclaration(isReadingExternalEntity());
        fDTDGrammar->putElemDecl((XMLElementDecl*) elemDecl);
    }

    // If we have a doc type handler, tell it the att list is starting
    if (fDocTypeHandler)
        fDocTypeHandler->startAttList(*elemDecl);

    //
    //  Now we loop until we are done with all of the attributes in this
    //  list. We need a buffer to use for local processing.
    //
    XMLBufBid   bbTmp(fBufMgr);
    XMLBuffer&  tmpBuf = bbTmp.getBuffer();
    bool        seenAnId = false;
    while (true)
    {
        // Get the next char out and see what it tells us to do
        const XMLCh nextCh = fReaderMgr->peekNextChar();

        // Watch for EOF
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chCloseAngle)
        {
            // We are done with this attribute list
            fReaderMgr->getNextChar();
            break;
        }
         else if (fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
        {
            //
            //  If advanced callbacks are enabled and we have a doc
            //  type handler, then gather up the white space and call
            //  back on the doctype handler. Otherwise, just skip
            //  whitespace.
            //
            if (fDocTypeHandler)
            {
                fReaderMgr->getSpaces(tmpBuf);
                fDocTypeHandler->doctypeWhitespace
                (
                    tmpBuf.getRawBuffer()
                    , tmpBuf.getLen()
                );
            }
             else
            {
                fReaderMgr->skipPastSpaces();
            }
        }
         else if (nextCh == chPercent)
        {
            // Eat the percent and expand the ref
            fReaderMgr->getNextChar();
            expandPERef(false, false, true);
        }
         else
        {
            //
            //  It must be an attribute name, so scan it. We let
            //  it use our local buffer for its name scanning.
            //
            XMLAttDef* attDef = scanAttDef(*elemDecl, tmpBuf);

            if (!attDef)
            {
                fReaderMgr->skipPastChar(chCloseAngle);
                break;
            }

            //
            //  If we are validating and its an ID type, then we have to
            //  make sure that we have not seen an id attribute yet. Set
            //  the flag to say that we've seen one now also.
            //
            if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
            {
                if (attDef->getType() == XMLAttDef::ID)
                {
                    if (seenAnId)
                        fScanner->getValidator()->emitError(XMLValid::MultipleIdAttrs, elemDecl->getFullName());
                    seenAnId = true;
                }
            }
        }
    }

    // If we have a doc type handler, tell it the att list is ending
    if (fDocTypeHandler)
        fDocTypeHandler->endAttList(*elemDecl);
}